

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void __thiscall kratos::InlineGeneratorVisitor::visit(InlineGeneratorVisitor *this,Generator *top)

{
  element_type *peVar1;
  Generator *this_00;
  pointer pcVar2;
  pointer psVar3;
  bool bVar4;
  __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
  _Var5;
  _Rb_tree_node_base *p_Var6;
  undefined8 extraout_RAX;
  GeneratorException *this_01;
  undefined1 child [8];
  PortInfo PVar7;
  initializer_list<kratos::IRNode_*> __l;
  undefined1 local_d8 [8];
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  child_generators;
  undefined1 auStack_b8 [8];
  PortInfo res;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
  inline_stmts;
  undefined1 local_58 [32];
  uint local_38;
  allocator_type local_31;
  
  Generator::get_child_generators
            ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
              *)local_d8,top);
  psVar3 = child_generators.
           super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((local_d8 !=
       (undefined1  [8])
       child_generators.
       super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
       ._M_impl.super__Vector_impl_data._M_start) &&
     (_Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Generator>*,std::vector<std::shared_ptr<kratos::Generator>,std::allocator<std::shared_ptr<kratos::Generator>>>>,__gnu_cxx::__ops::_Iter_negate<kratos::InlineGeneratorVisitor::visit(kratos::Generator*)::_lambda(auto:1_const&)_1_>>
                        (local_d8,child_generators.
                                  super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start),
     _Var5._M_current == psVar3)) {
    port_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    inline_stmts.
    super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    child_generators.
    super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         child_generators.
         super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (local_d8 !=
        (undefined1  [8])
        child_generators.
        super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_38 = 0;
      child = local_d8;
      do {
        peVar1 = (((shared_ptr<kratos::Generator> *)child)->
                 super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        res.stmt = (AssignStmt *)&port_names._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::string::_M_construct<char_const*>((string *)&res.stmt,"inline","");
        bVar4 = IRNode::has_attribute(&peVar1->super_IRNode,(string *)&res.stmt);
        if (res.stmt != (AssignStmt *)&port_names._M_t._M_impl.super__Rb_tree_header) {
          operator_delete(res.stmt,port_names._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1
                         );
        }
        if (bVar4) {
          peVar1 = (((shared_ptr<kratos::Generator> *)child)->
                   super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (((peVar1->is_cloned_ != false) ||
              ((peVar1->lib_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (peVar1->lib_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) || ((peVar1->is_external_ & 1U) != 0)) {
            this_01 = (GeneratorException *)__cxa_allocate_exception(0x10);
            res.stmt = (AssignStmt *)&port_names._M_t._M_impl.super__Rb_tree_header;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&res.stmt,"Cannot inline cloned or external modules","");
            auStack_b8 = (undefined1  [8])
                         (((shared_ptr<kratos::Generator> *)child)->
                         super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            __l._M_len = 2;
            __l._M_array = (iterator)auStack_b8;
            res._0_8_ = top;
            std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                      ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_58,__l,
                       &local_31);
            GeneratorException::GeneratorException
                      (this_01,(string *)&res.stmt,
                       (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_58);
            __cxa_throw(this_01,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&res.stmt,
                     &(((((shared_ptr<kratos::Generator> *)child)->
                        super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      ports_)._M_t);
          for (p_Var6 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var6 != (_Rb_tree_node_base *)&port_names;
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
            Generator::get_port((Generator *)local_58,
                                (string *)
                                (((shared_ptr<kratos::Generator> *)child)->
                                super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
            PVar7 = get_port_assignment((Port *)local_58._0_8_);
            res._0_8_ = PVar7.stmt;
            auStack_b8._0_4_ = PVar7.direction;
            if ((AssignStmt *)res._0_8_ != (AssignStmt *)0x0) {
              if (inline_stmts.
                  super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
                std::
                vector<kratos::InlineGeneratorVisitor::PortInfo,std::allocator<kratos::InlineGeneratorVisitor::PortInfo>>
                ::_M_realloc_insert<kratos::InlineGeneratorVisitor::PortInfo&>
                          ((vector<kratos::InlineGeneratorVisitor::PortInfo,std::allocator<kratos::InlineGeneratorVisitor::PortInfo>>
                            *)&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (iterator)0x0,(PortInfo *)auStack_b8);
              }
              else {
                *(undefined1 (*) [8])
                 inline_stmts.
                 super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start = auStack_b8;
                (inline_stmts.
                 super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start)->stmt = (AssignStmt *)res._0_8_;
                inline_stmts.
                super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     inline_stmts.
                     super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
              }
            }
            if ((pointer)local_58._8_8_ != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
            }
          }
          this_00 = (((shared_ptr<kratos::Generator> *)child)->
                    super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          peVar1 = (((shared_ptr<kratos::Generator> *)child)->
                   super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_58._0_8_ = local_58 + 0x10;
          pcVar2 = (peVar1->instance_name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,pcVar2,pcVar2 + (peVar1->instance_name)._M_string_length);
          std::__cxx11::string::append((char *)local_58);
          Generator::transfer_content(this_00,top,(string *)local_58);
          if ((Port *)local_58._0_8_ != (Port *)(local_58 + 0x10)) {
            operator_delete((void *)local_58._0_8_,
                            (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_58._16_8_)->_M_dataplus)._M_p + 1));
          }
          Generator::remove_child_generator(top,(shared_ptr<kratos::Generator> *)child);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&res.stmt);
          local_38 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
        child = (undefined1  [8])((long)child + 0x10);
      } while (child != (undefined1  [8])
                        child_generators.
                        super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((local_38 & 1) != 0) {
        optimize_passthrough_assignment
                  (top,(vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
                        *)&port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
    if (port_names._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      operator_delete((void *)port_names._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      -port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  std::
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           *)local_d8);
  return;
}

Assistant:

void visit(Generator* top) override {
        auto child_generators = top->get_child_generators();
        if (child_generators.empty()) return;
        // calculate if we should inline or not
        bool start_inline =
            std::all_of(child_generators.begin(), child_generators.end(),
                        [](auto const& gen) { return gen->get_child_generator_size() == 0; });
        if (!start_inline) return;

        std::vector<PortInfo> inline_stmts;
        bool has_inlined_inst = false;
        for (auto const& child : child_generators) {
            if (!child->has_attribute("inline")) {
                continue;
            }
            if (child->is_cloned() || child->external()) {
                throw GeneratorException("Cannot inline cloned or external modules",
                                         {child.get(), top});
            }
            has_inlined_inst = true;
            // figure out which port we should focus on
            auto port_names = child->get_port_names();
            for (auto const& port_name : port_names) {
                auto const& port = child->get_port(port_name);
                auto res = get_port_assignment(port.get());
                if (res.stmt) {
                    inline_stmts.emplace_back(res);
                }
            }

            child->transfer_content(*top, child->instance_name + "_");
            top->remove_child_generator(child);
        }
        if (has_inlined_inst) {
            optimize_passthrough_assignment(top, inline_stmts);
        }
    }